

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

void obj_chain(menulist *menu,char *src,obj *chain,long *total_count,long *total_size)

{
  int iVar1;
  long lVar2;
  nh_menuitem *pnVar3;
  int iVar4;
  long lVar5;
  obj *obj;
  char buf [256];
  char acStack_108 [256];
  
  if (chain == (obj *)0x0) {
    lVar5 = 0;
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    lVar5 = 0;
    do {
      lVar5 = lVar5 + 1;
      lVar2 = (ulong)chain->onamelth + chain->oxlth + lVar2 + 0x68;
      chain = chain->nobj;
    } while (chain != (obj *)0x0);
  }
  *total_count = *total_count + lVar5;
  *total_size = *total_size + lVar2;
  sprintf(acStack_108,"%-18s %4ld  %6ld",src,lVar5,lVar2);
  iVar4 = menu->icount;
  iVar1 = menu->size;
  pnVar3 = menu->items;
  if (iVar1 <= iVar4) {
    menu->size = iVar1 * 2;
    pnVar3 = (nh_menuitem *)realloc(pnVar3,(long)iVar1 * 0x218);
    menu->items = pnVar3;
    iVar4 = menu->icount;
  }
  pnVar3 = pnVar3 + iVar4;
  pnVar3->id = 0;
  pnVar3->role = MI_TEXT;
  pnVar3->accel = '\0';
  pnVar3->group_accel = '\0';
  pnVar3->selected = '\0';
  strcpy(pnVar3->caption,acStack_108);
  menu->icount = menu->icount + 1;
  return;
}

Assistant:

static void obj_chain(struct menulist *menu, const char *src, struct obj *chain,
		      long *total_count, long *total_size)
{
	char buf[BUFSZ];
	long count = 0, size = 0;

	count_obj(chain, &count, &size, TRUE, FALSE);
	*total_count += count;
	*total_size += size;
	sprintf(buf, template, src, count, size);
	add_menutext(menu, buf);
}